

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O2

JavascriptBigInt * Js::JavascriptBigInt::MulAbsolute(JavascriptBigInt *pbi1,JavascriptBigInt *pbi2)

{
  ScriptContext *scriptContext;
  unsigned_long *puVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  JavascriptBigInt *pJVar5;
  undefined4 *puVar6;
  ulong uVar7;
  Type TVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  digit_t dVar13;
  ulong uVar14;
  digit_t local_38;
  
  dVar13 = pbi2->m_length + pbi1->m_length;
  scriptContext =
       (((((pbi1->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  if (dVar13 >> 0x3d != 0) {
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5fff3,L"Multiply BigInt");
  }
  pJVar5 = CreateZeroWithLength(dVar13,scriptContext);
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar7 = 0;
  for (uVar12 = 0; uVar12 < pbi1->m_length; uVar12 = uVar12 + 1) {
    local_38 = 0;
    uVar11 = 0;
    uVar9 = uVar12;
    for (uVar14 = 0; uVar14 < pbi2->m_length; uVar14 = uVar14 + 1) {
      puVar1 = (pJVar5->m_digits).ptr;
      uVar2 = puVar1[uVar9];
      uVar7 = uVar11 + uVar2;
      puVar1[uVar9] = uVar7;
      dVar13 = MulDigit((pbi1->m_digits).ptr[uVar12],(pbi2->m_digits).ptr[uVar14],&local_38);
      uVar10 = (ulong)CARRY8(dVar13,uVar7);
      puVar1[uVar9] = dVar13 + uVar7;
      uVar7 = (ulong)CARRY8(uVar11,uVar2);
      uVar11 = local_38 + uVar7;
      if (CARRY8(local_38,uVar7)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                    ,0x250,"(overflow == 0)","overflow == 0");
        if (!bVar4) goto LAB_00bc9457;
        *puVar6 = 0;
LAB_00bc9368:
        local_38 = uVar11 + uVar10;
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                    ,0x252,"(overflow == 0)","overflow == 0");
        if (!bVar4) goto LAB_00bc9457;
        *puVar6 = 0;
      }
      else {
        local_38 = uVar11 + uVar10;
        if (CARRY8(uVar11,uVar10)) goto LAB_00bc9368;
      }
      uVar11 = uVar11 + uVar10;
      uVar7 = uVar9;
      uVar9 = uVar9 + 1;
    }
    if (uVar11 != 0) {
      (pJVar5->m_digits).ptr[uVar7 + 1] = uVar11;
    }
  }
  TVar8 = pJVar5->m_length;
  while (TVar8 = TVar8 - 1, TVar8 != 0xffffffffffffffff) {
    if ((pJVar5->m_digits).ptr[TVar8] != 0) {
      return pJVar5;
    }
    pJVar5->m_length = TVar8;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  *puVar6 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                              ,0x25f,"(pbi3->m_length > 0)","pbi3->m_length > 0");
  if (bVar4) {
    *puVar6 = 0;
    return pJVar5;
  }
LAB_00bc9457:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

JavascriptBigInt * JavascriptBigInt::MulAbsolute(JavascriptBigInt * pbi1, JavascriptBigInt * pbi2)
    {
        // Start with maximum length possible in pbi3
        digit_t length = pbi1->m_length + pbi2->m_length;
        if (SIZE_MAX / sizeof(digit_t) < length) // overflow 
        {
            JavascriptError::ThrowRangeError(pbi1->GetScriptContext(), VBSERR_TypeMismatch, _u("Multiply BigInt"));
        }
        JavascriptBigInt * pbi3 = JavascriptBigInt::CreateZeroWithLength(length, pbi1->GetScriptContext());

        // Compute pbi3 = pbi1 * pbi2 as follow:
        // e.g. A1 A0 * B1 B0 = C3 C2 C1 C0
        // C0 = A0 * B0 (take the digit and carry)
        // C1 = carry + A0 * B1 + A1 * B0 (take the digit and carry)
        // C2 = carry + A1 * B1 (take the digit and carry)
        // C3 = carry
        digit_t carryDigit = 0;
        digit_t i3 = 0;

        for (digit_t i1 = 0; i1 < pbi1->m_length; i1++)
        {
            carryDigit = 0;
            for (digit_t i2 = 0; i2 < pbi2->m_length; i2++)
            {
                i3 = i1 + i2;
                digit_t tempCarryDigit1 = 0;
                digit_t tempCarryDigit2 = 0;
                pbi3->m_digits[i3] = JavascriptBigInt::AddDigit(pbi3->m_digits[i3], carryDigit, &tempCarryDigit1);
                digit_t mulDigitResult = JavascriptBigInt::MulDigit(pbi1->m_digits[i1], pbi2->m_digits[i2], &carryDigit);
                pbi3->m_digits[i3] = JavascriptBigInt::AddDigit(pbi3->m_digits[i3], mulDigitResult, &tempCarryDigit2);
                digit_t overflow = 0;
                carryDigit = JavascriptBigInt::AddDigit(carryDigit, tempCarryDigit1, &overflow);
                Assert(overflow == 0); // [i1] * [i2] can not carry through [i1+i2+2]
                carryDigit = JavascriptBigInt::AddDigit(carryDigit, tempCarryDigit2, &overflow);
                Assert(overflow == 0); // [i1] * [i2] can not carry through [i1+i2+2]
            }
            if (carryDigit > 0)
            {
                pbi3->m_digits[i3 + 1] = carryDigit;
            }
        }
        
        // adjust length
        while ((pbi3->m_length > 0) && (pbi3->m_digits[pbi3->m_length - 1] == 0))
        {
            pbi3->m_length--;
        }
        Assert(pbi3->m_length > 0);
        return pbi3;
    }